

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprIfTrue(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  byte bVar1;
  Vdbe *p;
  int iVar2;
  int in2;
  uint uVar3;
  uint uVar4;
  Expr *pRight;
  long lVar5;
  Expr *pEVar6;
  int regFree1;
  int regFree2;
  
  p = pParse->pVdbe;
  _regFree1 = 0;
  if (pExpr == (Expr *)0x0 || p == (Vdbe *)0x0) {
    return;
  }
  uVar4 = (uint)pExpr->op;
  switch(pExpr->op) {
  case 'D':
    sqlite3ExprIfTrue(pParse,pExpr->pLeft,dest,jumpIfNull);
    sqlite3ExprIfTrue(pParse,pExpr->pRight,dest,jumpIfNull);
    break;
  case 'E':
    uVar4 = sqlite3VdbeMakeLabel(p);
    pParse->iCacheLevel = pParse->iCacheLevel + 1;
    sqlite3ExprIfFalse(pParse,pExpr->pLeft,uVar4,jumpIfNull ^ 8);
    pEVar6 = pExpr->pRight;
    sqlite3ExprIfTrue(pParse,pEVar6,dest,jumpIfNull);
    if (p->aLabel != (int *)0x0) {
      p->aLabel[(int)~uVar4] = p->nOp;
    }
    sqlite3ExprCachePop(pParse,(int)pEVar6);
    break;
  case 'G':
    exprCodeBetween(pParse,pExpr,dest,1,jumpIfNull);
    break;
  case 'H':
    uVar3 = sqlite3VdbeMakeLabel(p);
    uVar4 = dest;
    if (jumpIfNull == 0) {
      uVar4 = uVar3;
    }
    sqlite3ExprCodeIN(pParse,pExpr,uVar3,uVar4);
    sqlite3VdbeAddOp3(p,1,0,dest,0);
    if (p->aLabel != (int *)0x0) {
      p->aLabel[(int)~uVar3] = p->nOp;
    }
    break;
  case 'I':
  case 'J':
    iVar2 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    uVar3 = 0;
LAB_00199a75:
    sqlite3VdbeAddOp3(p,uVar4,iVar2,dest,uVar3);
    break;
  case 'K':
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
    iVar2 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    in2 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    pEVar6 = pExpr->pLeft;
    pRight = pExpr->pRight;
    goto LAB_0019995f;
  default:
    if (uVar4 == 0x13) {
      sqlite3ExprIfFalse(pParse,pExpr->pLeft,dest,jumpIfNull);
      break;
    }
    if (uVar4 != 0x92) {
      iVar2 = sqlite3ExprCodeTemp(pParse,pExpr,&regFree1);
      uVar3 = (uint)(jumpIfNull != 0);
      uVar4 = 0x1b;
      goto LAB_00199a75;
    }
  case 'F':
    iVar2 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    in2 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    uVar4 = (uVar4 == 0x46) + 0x4b;
    pEVar6 = pExpr->pLeft;
    pRight = pExpr->pRight;
    jumpIfNull = 0x80;
LAB_0019995f:
    codeCompare(pParse,pEVar6,pRight,uVar4,iVar2,in2,dest,jumpIfNull);
  }
  if (regFree1 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      lVar5 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar5) == regFree1) {
          (&pParse->aColCache[0].tempReg)[lVar5] = '\x01';
          goto LAB_00199af3;
        }
        lVar5 = lVar5 + 0x18;
      } while ((int)lVar5 != 0xf0);
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree1;
    }
  }
LAB_00199af3:
  if (regFree2 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      lVar5 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar5) == regFree2) {
          (&pParse->aColCache[0].tempReg)[lVar5] = '\x01';
          return;
        }
        lVar5 = lVar5 + 0x18;
      } while ((int)lVar5 != 0xf0);
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfTrue(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) )     return;  /* Existence of VDBE checked by caller */
  if( NEVER(pExpr==0) ) return;  /* No way this can happen */
  op = pExpr->op;
  switch( op ){
    case TK_AND: {
      int d2 = sqlite3VdbeMakeLabel(v);
      testcase( jumpIfNull==0 );
      sqlite3ExprCachePush(pParse);
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, d2,jumpIfNull^SQLITE_JUMPIFNULL);
      sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
      sqlite3VdbeResolveLabel(v, d2);
      sqlite3ExprCachePop(pParse, 1);
      break;
    }
    case TK_OR: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
      sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      assert( TK_LT==OP_Lt );
      assert( TK_LE==OP_Le );
      assert( TK_GT==OP_Gt );
      assert( TK_GE==OP_Ge );
      assert( TK_EQ==OP_Eq );
      assert( TK_NE==OP_Ne );
      testcase( op==TK_LT );
      testcase( op==TK_LE );
      testcase( op==TK_GT );
      testcase( op==TK_GE );
      testcase( op==TK_EQ );
      testcase( op==TK_NE );
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      testcase( op==TK_IS );
      testcase( op==TK_ISNOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      assert( TK_ISNULL==OP_IsNull );
      assert( TK_NOTNULL==OP_NotNull );
      testcase( op==TK_ISNULL );
      testcase( op==TK_NOTNULL );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, 1, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(v);
      int destIfNull = jumpIfNull ? dest : destIfFalse;
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeAddOp2(v, OP_Goto, 0, dest);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      break;
    }
#endif
    default: {
      r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
      sqlite3VdbeAddOp3(v, OP_If, r1, dest, jumpIfNull!=0);
      testcase( regFree1==0 );
      testcase( jumpIfNull==0 );
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);  
}